

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O1

STArray * __thiscall
jbcoin::STObject::getFieldByConstRef<jbcoin::STArray,jbcoin::STArray>
          (STObject *this,SField *field,STArray *empty)

{
  int iVar1;
  STArray *pSVar2;
  
  iVar1 = getFieldIndex(this,field);
  if (iVar1 == -1) {
    pSVar2 = (STArray *)0x0;
  }
  else {
    pSVar2 = (STArray *)
             (this->v_).
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar1].p_;
  }
  if (pSVar2 == (STArray *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*(pSVar2->super_STBase)._vptr_STBase[4])(pSVar2);
  if (iVar1 != 0) {
    empty = (STArray *)0x0;
    if ((pSVar2->super_STBase)._vptr_STBase == (_func_int **)&PTR__STArray_002d6ed8) {
      empty = pSVar2;
    }
    if (empty == (STArray *)0x0) {
      Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
    }
  }
  return empty;
}

Assistant:

V const& getFieldByConstRef (SField const& field, V const& empty) const
    {
        const STBase* rf = peekAtPField (field);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        SerializedTypeID id = rf->getSType ();

        if (id == STI_NOTPRESENT)
            return empty; // optional field not present

        const T* cf = dynamic_cast<const T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        return *cf;
    }